

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_between.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundBetweenExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  DataChunk *this_00;
  reference result_00;
  reference result_01;
  reference result_02;
  type pEVar1;
  reference pvVar2;
  vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
  *this_01;
  Vector intermediate1;
  Vector intermediate2;
  LogicalType local_130;
  LogicalType local_118;
  Vector local_100;
  Vector local_98;
  
  this_00 = &state->intermediate_chunk;
  DataChunk::Reset(this_00);
  result_00 = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
  result_01 = vector<duckdb::Vector,_true>::operator[](&this_00->data,1);
  result_02 = vector<duckdb::Vector,_true>::operator[](&this_00->data,2);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->input);
  this_01 = &state->child_states;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::operator[](this_01,0);
  Execute(this,pEVar1,
          (pvVar2->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,result_00)
  ;
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->lower);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::operator[](this_01,1);
  Execute(this,pEVar1,
          (pvVar2->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,result_01)
  ;
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->upper);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::operator[](this_01,2);
  Execute(this,pEVar1,
          (pvVar2->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,result_02)
  ;
  LogicalType::LogicalType(&local_118,BOOLEAN);
  Vector::Vector(&local_100,&local_118,0x800);
  LogicalType::~LogicalType(&local_118);
  LogicalType::LogicalType(&local_130,BOOLEAN);
  Vector::Vector(&local_98,&local_130,0x800);
  LogicalType::~LogicalType(&local_130);
  if (expr->upper_inclusive == true) {
    if (expr->lower_inclusive == false) {
      VectorOperations::GreaterThan(result_00,result_01,&local_100,count);
    }
    else {
      VectorOperations::GreaterThanEquals(result_00,result_01,&local_100,count);
    }
    VectorOperations::LessThanEquals(result_00,result_02,&local_98,count);
  }
  else {
    if (expr->lower_inclusive == false) {
      VectorOperations::GreaterThan(result_00,result_01,&local_100,count);
    }
    else {
      VectorOperations::GreaterThanEquals(result_00,result_01,&local_100,count);
    }
    VectorOperations::LessThan(result_00,result_02,&local_98,count);
  }
  VectorOperations::And(&local_100,&local_98,result,count);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  if (local_100.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_100.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_100.type);
  return;
}

Assistant:

void ExpressionExecutor::Execute(const BoundBetweenExpression &expr, ExpressionState *state, const SelectionVector *sel,
                                 idx_t count, Vector &result) {
	// resolve the children
	state->intermediate_chunk.Reset();

	auto &input = state->intermediate_chunk.data[0];
	auto &lower = state->intermediate_chunk.data[1];
	auto &upper = state->intermediate_chunk.data[2];

	Execute(*expr.input, state->child_states[0].get(), sel, count, input);
	Execute(*expr.lower, state->child_states[1].get(), sel, count, lower);
	Execute(*expr.upper, state->child_states[2].get(), sel, count, upper);

	Vector intermediate1(LogicalType::BOOLEAN);
	Vector intermediate2(LogicalType::BOOLEAN);

	if (expr.upper_inclusive && expr.lower_inclusive) {
		VectorOperations::GreaterThanEquals(input, lower, intermediate1, count);
		VectorOperations::LessThanEquals(input, upper, intermediate2, count);
	} else if (expr.lower_inclusive) {
		VectorOperations::GreaterThanEquals(input, lower, intermediate1, count);
		VectorOperations::LessThan(input, upper, intermediate2, count);
	} else if (expr.upper_inclusive) {
		VectorOperations::GreaterThan(input, lower, intermediate1, count);
		VectorOperations::LessThanEquals(input, upper, intermediate2, count);
	} else {
		VectorOperations::GreaterThan(input, lower, intermediate1, count);
		VectorOperations::LessThan(input, upper, intermediate2, count);
	}
	VectorOperations::And(intermediate1, intermediate2, result, count);
}